

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O3

void __thiscall BoardView::DrawPins(BoardView *this,ImDrawList *draw)

{
  float *pfVar1;
  unsigned_short *__src;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  Net *pNVar3;
  element_type *peVar4;
  undefined1 auVar5 [16];
  double dVar6;
  ImVec2 IVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ImDrawList *pIVar14;
  bool bVar15;
  int iVar16;
  ImGuiIO *pIVar17;
  undefined4 extraout_var;
  __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
  _Var18;
  ulong uVar19;
  ImVec2 *pIVar20;
  ImVec2 IVar21;
  long lVar22;
  int iVar23;
  uint uVar24;
  ImFont *font;
  long *plVar25;
  byte bVar26;
  uint uVar27;
  uint32_t uVar28;
  ImFont *this_01;
  void *ptr;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  string text;
  ImVec2 pos_pin_name;
  ImVec2 pos_net_name;
  ImGuiIO io;
  float local_3a3c;
  undefined1 local_3a38 [16];
  uint local_3a20;
  uint local_3a1c;
  undefined1 local_3a18 [8];
  undefined4 uStack_3a10;
  undefined4 uStack_3a0c;
  float fStack_3a04;
  ImVec2 local_39f0;
  ImVec2 local_39e8;
  long local_39e0;
  ImVec2 IStack_39d8;
  ImVec2 local_39d0 [2];
  long local_39c0 [2];
  uint32_t local_39ac;
  ImDrawList *local_39a8;
  ImVec2 local_39a0;
  undefined1 local_3998 [24];
  ImDrawListSplitter *local_3980;
  ImVec2 local_3978;
  ImVec2 local_3970;
  shared_ptr<Component> local_3968;
  undefined1 local_3958 [24];
  long *local_3940;
  float local_3938;
  float fStack_3934;
  float fStack_3930;
  float fStack_392c;
  undefined1 local_3928 [11168];
  long local_d88;
  void *pvStack_d80;
  undefined1 auStack_d78 [3400];
  
  local_39a8 = draw;
  pIVar17 = ImGui::GetIO();
  memcpy(local_3928,pIVar17,0x2b9e);
  local_d88 = 0;
  pvStack_d80 = (void *)0x0;
  uVar24 = (pIVar17->InputQueueCharacters).Size;
  if (0 < (long)(int)uVar24) {
    uVar27 = 8;
    if (8 < uVar24) {
      uVar27 = uVar24;
    }
    pvStack_d80 = ImGui::MemAlloc((ulong)(uVar27 * 2));
    local_d88 = (ulong)uVar27 << 0x20;
  }
  ptr = pvStack_d80;
  local_d88 = CONCAT44(local_d88._4_4_,uVar24);
  __src = (pIVar17->InputQueueCharacters).Data;
  if (__src != (unsigned_short *)0x0) {
    memcpy(pvStack_d80,__src,(long)(int)uVar24 * 2);
  }
  memcpy(auStack_d78,pIVar17->KeyMap,0xd44);
  pIVar14 = local_39a8;
  if ((this->config).showPins == true) {
    local_3a1c = 0xffffffff;
    local_3a20 = 0;
    if (((this->config).pinSelectMasks == true) &&
       (((this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0 ||
        ((this->m_pinHighlighted).
         super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
         super__Vector_impl_data._M_finish !=
         (this->m_pinHighlighted).
         super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
         super__Vector_impl_data._M_start)))) {
      local_3a1c = (this->m_colors).selectedMaskPins;
      local_3a20 = (this->m_colors).orMaskPins;
    }
    if ((this->config).slowCPU == false) {
      fVar29 = 0.0;
    }
    else {
      fVar29 = 2.0;
    }
    local_3a3c = (this->config).pinSizeThresholdLow;
    local_3980 = &local_39a8->_Splitter;
    ImDrawListSplitter::SetCurrentChannel(local_3980,local_39a8,3);
    if ((this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      DrawNetWeb(this,pIVar14);
    }
    iVar16 = (*this->m_board->_vptr_Board[4])();
    plVar25 = *(long **)CONCAT44(extraout_var,iVar16);
    local_3940 = (long *)((long *)CONCAT44(extraout_var,iVar16))[1];
    if (plVar25 != local_3940) {
      if (local_3a3c <= fVar29) {
        local_3a3c = fVar29;
      }
      do {
        lVar22 = *plVar25;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar25[1];
        fVar29 = *(float *)(lVar22 + 0x58) * this->m_scale;
        local_3a38 = ZEXT416((uint)fVar29);
        uVar28 = (this->m_colors).pinDefaultTextColor;
        uVar24 = (this->m_colors).pinDefaultColor;
        if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if ((*(int *)(lVar22 + 8) == 2) || (*(int *)(lVar22 + 8) == this->m_current_side))
          goto LAB_0011e7ff;
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
          iVar16 = *(int *)(lVar22 + 8);
          iVar23 = this->m_current_side;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          if ((iVar16 == 2) || (iVar16 == iVar23)) {
            lVar22 = *plVar25;
LAB_0011e7ff:
            IVar21 = CoordToScreen(this,*(float *)(lVar22 + 0x50),*(float *)(lVar22 + 0x54),1.0);
            fVar31 = IVar21.y;
            if (((((-fVar29 <= IVar21.x) && (-fVar29 <= fVar31)) &&
                 (fVar30 = IVar21.x - fVar29,
                 fVar30 < (this->m_board_surface).x || fVar30 == (this->m_board_surface).x)) &&
                (pfVar1 = &(this->m_board_surface).y,
                fVar31 - fVar29 < *pfVar1 || fVar31 - fVar29 == *pfVar1)) &&
               (((this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                 (element_type *)0x0 || (local_3a3c <= fVar29)))) {
              local_3998._8_4_ = extraout_XMM0_Dc;
              local_3998._0_4_ = IVar21.x;
              local_3998._4_4_ = IVar21.y;
              local_3998._12_4_ = extraout_XMM0_Dd;
              local_3938 = fVar31;
              fStack_3934 = fVar31;
              fStack_3930 = fVar31;
              fStack_392c = fVar31;
              _Var18 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Pin>*,std::vector<std::shared_ptr<Pin>,std::allocator<std::shared_ptr<Pin>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<Pin>const>>
                                 ((this->m_pinHighlighted).
                                  super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (this->m_pinHighlighted).
                                  super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,plVar25);
              if (_Var18._M_current ==
                  (this->m_pinHighlighted).
                  super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                uVar24 = uVar24 & local_3a1c | local_3a20;
                uVar27 = 0xffff8888;
                auVar8._12_4_ = 0;
                auVar8._0_12_ = stack0xffffffffffffc5ec;
                _local_3a18 = auVar8 << 0x20;
              }
              else {
                dVar6 = (this->config).fontSize * 0.5;
                if ((double)fVar29 < dVar6) {
                  local_3a38._4_4_ = (int)((ulong)dVar6 >> 0x20);
                  local_3a38._0_4_ = (float)dVar6;
                  local_3a38._8_8_ = 0;
                }
                uVar28 = (this->m_colors).pinSelectedTextColor;
                uVar27 = (this->m_colors).pinSelectedFillColor;
                uVar24 = (this->m_colors).pinSelectedColor;
                local_3a3c = 0.0;
                local_3a18._0_4_ = 1;
              }
              local_3968.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(element_type **)(*plVar25 + 0x68);
              local_3968.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                   = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*plVar25 + 0x70);
              if (local_3968.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_3968.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count =
                       (local_3968.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_3968.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count =
                       (local_3968.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              bVar15 = PartIsHighlighted(this,&local_3968);
              if (local_3968.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_3968.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              bVar26 = local_3a18[0];
              if (bVar15) {
                uVar24 = (this->m_colors).pinDefaultColor;
                uVar28 = (this->m_colors).pinDefaultTextColor;
                local_3a3c = 0.0;
                bVar26 = 1;
                auVar9._12_4_ = 0;
                auVar9._0_12_ = stack0xffffffffffffc5ec;
                _local_3a18 = auVar9 << 0x20;
              }
              peVar2 = (element_type *)*plVar25;
              iVar16 = *(int *)&(peVar2->super_BoardElement).field_0xc;
              if (iVar16 == 4) {
                uVar24 = (this->m_colors).pinTestPadColor & local_3a1c | local_3a20;
                uVar27 = (this->m_colors).pinTestPadFillColor & local_3a1c | local_3a20;
                bVar26 = 0;
              }
              if (((peVar2->component).super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->visualmode == '\x01') {
                uVar24 = (this->m_colors).pinDefaultColor;
                uVar28 = (this->m_colors).pinDefaultTextColor;
                local_3a3c = 0.0;
                bVar26 = 1;
                auVar10._12_4_ = 0;
                auVar10._0_12_ = stack0xffffffffffffc5ec;
                _local_3a18 = auVar10 << 0x20;
              }
              pNVar3 = peVar2->net;
              if (iVar16 == 1 || pNVar3 == (Net *)0x0) {
                uVar24 = (this->m_colors).pinNotConnectedColor;
LAB_0011ea28:
                uVar24 = uVar24 & local_3a1c | local_3a20;
              }
              else if (pNVar3->is_ground == true) {
                uVar24 = (this->m_colors).pinGroundColor;
                goto LAB_0011ea28;
              }
              peVar4 = (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              bVar15 = true;
              if ((peVar4 != (element_type *)0x0) && (pNVar3 == peVar4->net)) {
                dVar6 = (this->config).fontSize * 0.5;
                if ((double)(float)local_3a38._0_4_ < dVar6) {
                  local_3a38._4_4_ = (int)((ulong)dVar6 >> 0x20);
                  local_3a38._0_4_ = (float)dVar6;
                  local_3a38._8_8_ = 0;
                }
                uVar24 = (this->m_colors).pinSameNetColor;
                uVar28 = (this->m_colors).pinSameNetTextColor;
                uVar27 = (this->m_colors).pinSameNetFillColor;
                local_3a3c = 0.0;
                local_3a18._0_4_ = 1;
                bVar15 = false;
                bVar26 = 1;
              }
              if (peVar2 == peVar4) {
                dVar6 = (this->config).fontSize * 0.5;
                if ((double)(float)local_3a38._0_4_ < dVar6) {
                  local_3a38._4_4_ = (int)((ulong)dVar6 >> 0x20);
                  local_3a38._0_4_ = (float)dVar6;
                  local_3a38._8_8_ = 0;
                }
                uVar24 = (this->m_colors).pinSelectedColor;
                uVar28 = (this->m_colors).pinSelectedTextColor;
                uVar27 = (this->m_colors).pinSelectedFillColor;
                local_3a3c = 0.0;
                local_3a18._0_4_ = 1;
                bVar15 = false;
                bVar26 = 1;
              }
              auVar8 = _local_3a18;
              iVar16 = std::__cxx11::string::compare((char *)&peVar2->name);
              if (iVar16 == 0) {
                uVar27 = (this->m_colors).pinA1PadColor;
                local_3a18._1_3_ = 0;
                local_3a18[0] = uVar27 != 0;
                stack0xffffffffffffc5ec = auVar8._4_12_;
                bVar15 = false;
                uVar24 = uVar27;
              }
              auVar8 = _local_3a18;
              iVar16 = std::__cxx11::string::compare((char *)(*plVar25 + 0x10));
              lVar22 = *(long *)(*plVar25 + 0x68);
              if (iVar16 == 0) {
                uVar19 = *(long *)(lVar22 + 0x60) - *(long *)(lVar22 + 0x58);
                if ((ulong)(uint)(this->config).pinA1threshold <= (ulong)((long)uVar19 >> 4)) {
                  uVar27 = (this->m_colors).pinA1PadColor;
                  local_3a18._1_3_ = 0;
                  local_3a18[0] = uVar27 != 0;
                  stack0xffffffffffffc5ec = auVar8._4_12_;
                  bVar15 = false;
                  uVar24 = uVar27;
                }
              }
              else {
                uVar19 = *(long *)(lVar22 + 0x60) - *(long *)(lVar22 + 0x58);
              }
              local_3958[0] = 0x10 < uVar19;
              iVar16 = *(int *)(*plVar25 + 0xc);
              local_39ac = uVar28;
              fVar29 = roundf((float)local_3a38._0_4_);
              pIVar14 = local_39a8;
              uVar11 = local_3a38._4_4_;
              uVar12 = local_3a38._8_4_;
              uVar13 = local_3a38._12_4_;
              iVar23 = (int)fVar29;
              if (0x1f < iVar23) {
                iVar23 = 0x20;
              }
              if (iVar23 < 9) {
                iVar23 = 8;
              }
              fVar29 = (float)local_3a38._0_4_ * 0.5 + 0.5;
              bVar26 = iVar16 != 4 & bVar26 & local_3958[0];
              if (bVar26 == 1) {
                dVar6 = (this->config).fontSize * 0.5;
                if ((double)(float)local_3a38._0_4_ < dVar6) {
                  local_3a38._8_4_ = 0;
                  local_3a38._12_4_ = 0;
                  local_3a38._0_4_ = (undefined4)dVar6;
                }
LAB_0011ec6e:
                local_3a38._4_4_ = 0;
                if (((float)local_3a38._0_4_ <= 3.0) || ((float)local_3a38._0_4_ <= local_3a3c)) {
                  if (local_3a3c < (float)local_3a38._0_4_) {
                    if (local_3a18[0] != '\0') {
                      local_3a18._4_4_ = uVar11;
                      local_3a18._0_4_ = fVar29;
                      uStack_3a10 = uVar12;
                      uStack_3a0c = uVar13;
                      local_39f0.y = (float)local_3998._4_4_ - fVar29;
                      local_39f0.x = (float)local_3998._0_4_ - fVar29;
                      local_39d0[0].y = fVar29 + (float)local_3998._4_4_;
                      local_39d0[0].x = fVar29 + (float)local_3998._0_4_;
                      ImDrawList::AddRectFilled(local_39a8,&local_39f0,local_39d0,uVar27,0.0,0);
                    }
                    if (bVar15) {
                      local_39f0.y = (float)local_3998._4_4_ - fVar29;
                      local_39f0.x = (float)local_3998._0_4_ - fVar29;
                      local_39d0[0].y = fVar29 + (float)local_3998._4_4_;
                      local_39d0[0].x = fVar29 + (float)local_3998._0_4_;
                      ImDrawList::AddRect(pIVar14,&local_39f0,local_39d0,uVar24,0.0,0,1.0);
                    }
                  }
                }
                else if (((this->config).pinShapeSquare == false) &&
                        ((this->config).slowCPU != true)) {
                  if (local_3a18[0] != '\0') {
                    local_39f0 = local_3998._0_8_;
                    ImDrawList::AddCircleFilled
                              (local_39a8,&local_39f0,(float)local_3a38._0_4_,uVar27,iVar23);
                  }
                  if (bVar15) {
                    local_39f0.y = (float)local_3998._4_4_;
                    local_39f0.x = (float)local_3998._0_4_;
                    ImDrawList::AddCircle
                              (pIVar14,&local_39f0,(float)local_3a38._0_4_,uVar24,iVar23,1.0);
                  }
                }
                else {
                  if (local_3a18[0] != '\0') {
                    local_3a18._4_4_ = uVar11;
                    local_3a18._0_4_ = fVar29;
                    uStack_3a10 = uVar12;
                    uStack_3a0c = uVar13;
                    local_39f0.y = (float)local_3998._4_4_ - fVar29;
                    local_39f0.x = (float)local_3998._0_4_ - fVar29;
                    local_39d0[0].y = fVar29 + (float)local_3998._4_4_;
                    local_39d0[0].x = fVar29 + (float)local_3998._0_4_;
                    ImDrawList::AddRectFilled(local_39a8,&local_39f0,local_39d0,uVar27,0.0,0);
                  }
                  if (bVar15) {
                    local_39f0.y = (float)local_3998._4_4_ - fVar29;
                    local_39f0.x = (float)local_3998._0_4_ - fVar29;
                    local_39d0[0].y = fVar29 + (float)local_3998._4_4_;
                    local_39d0[0].x = fVar29 + (float)local_3998._0_4_;
                    ImDrawList::AddRect(pIVar14,&local_39f0,local_39d0,uVar24,0.0,0,1.0);
                  }
                }
              }
              else {
                if (iVar16 != 4) goto LAB_0011ec6e;
                if (((float)local_3a38._0_4_ <= 3.0) || ((this->config).slowCPU != false)) {
                  if (local_3a3c < (float)local_3a38._0_4_) {
                    local_39f0.y = (float)local_3998._4_4_ - fVar29;
                    local_39f0.x = (float)local_3998._0_4_ - fVar29;
                    local_39d0[0].y = fVar29 + (float)local_3998._4_4_;
                    local_39d0[0].x = fVar29 + (float)local_3998._0_4_;
                    ImDrawList::AddRectFilled(local_39a8,&local_39f0,local_39d0,uVar27,0.0,0);
                  }
                }
                else {
                  local_39f0 = local_3998._0_8_;
                  ImDrawList::AddCircleFilled
                            (local_39a8,&local_39f0,(float)local_3a38._0_4_,uVar27,iVar23);
                  auVar8 = local_3998._0_16_;
                  local_39f0.x = (float)local_3998._0_4_;
                  local_39f0.y = (float)local_3998._4_4_;
                  local_3998._0_16_ = auVar8;
                  ImDrawList::AddCircle
                            (pIVar14,&local_39f0,(float)local_3a38._0_4_,uVar24,iVar23,1.0);
                }
              }
              if ((byte)(bVar26 | 3.0 < (float)local_3a38._0_4_ & (this->config).showPinName) == 1)
              {
                local_39d0[0] = (ImVec2)local_39c0;
                lVar22 = *(long *)(*plVar25 + 0x30);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_39d0,lVar22,*(long *)(*plVar25 + 0x38) + lVar22);
                std::__cxx11::string::append((char *)local_39d0);
                pIVar20 = (ImVec2 *)
                          std::__cxx11::string::_M_append
                                    ((char *)local_39d0,
                                     *(ulong *)(*(long *)(*plVar25 + 0x60) + 0x10));
                local_39f0 = (ImVec2)&local_39e0;
                IVar21 = (ImVec2)(pIVar20 + 2);
                if (*pIVar20 == IVar21) {
                  local_39e0 = *(long *)IVar21;
                  IStack_39d8 = pIVar20[3];
                }
                else {
                  local_39e0 = *(long *)IVar21;
                  local_39f0 = *pIVar20;
                }
                local_39e8 = pIVar20[1];
                *pIVar20 = IVar21;
                pIVar20[1].x = 0.0;
                pIVar20[1].y = 0.0;
                *(undefined1 *)&pIVar20[2].x = 0;
                if (local_39d0[0] != (ImVec2)local_39c0) {
                  operator_delete((void *)local_39d0[0],local_39c0[0] + 1);
                }
                pIVar17 = ImGui::GetIO();
                this_01 = *(pIVar17->Fonts->Fonts).Data;
                IVar21 = ImFont::CalcTextSizeA
                                   (this_01,1.0,3.4028235e+38,0.0,(char *)local_39f0,(char *)0x0,
                                    (char **)0x0);
                auVar5._8_4_ = extraout_XMM0_Dc_00;
                auVar5._0_4_ = IVar21.x;
                auVar5._4_4_ = IVar21.y;
                auVar5._12_4_ = extraout_XMM0_Dd_00;
                fVar29 = ((float)local_3a38._0_4_ * 1.5) / IVar21.y;
                IVar7 = ImFont::CalcTextSizeA
                                  (this_01,fVar29,3.4028235e+38,0.0,*(char **)(*plVar25 + 0x30),
                                   (char *)0x0,(char **)0x0);
                local_3958._8_4_ = extraout_XMM0_Dc_01;
                local_3958._0_4_ = IVar7.x;
                local_3958._4_4_ = IVar7.y;
                local_3958._12_4_ = extraout_XMM0_Dd_01;
                local_3a18._0_4_ = IVar21.x;
                fVar31 = ((float)local_3a38._0_4_ * 2.125) / (float)local_3a18._0_4_;
                local_3a18._0_4_ = fVar29;
                if (fVar31 <= fVar29) {
                  local_3a18._0_4_ = fVar31;
                }
                stack0xffffffffffffc5ec = auVar5._4_12_;
                IVar21 = ImFont::CalcTextSizeA
                                   (this_01,(float)local_3a18._0_4_,3.4028235e+38,0.0,
                                    *(char **)(*(long *)(*plVar25 + 0x60) + 0x10),(char *)0x0,
                                    (char **)0x0);
                local_39d0[0].y = (float)local_3998._4_4_ - (float)local_3958._4_4_;
                local_39d0[0].x = (float)local_3998._0_4_ - (float)local_3958._0_4_ * 0.5;
                local_39a0.x = (float)local_3998._0_4_ - IVar21.x * 0.5;
                local_39a0.y = local_3938;
                if (this_01->FontSize * 0.75 <= fVar29) {
                  font = this_01;
                  if ((this_01->FontSize * 1.5 < fVar29) &&
                     (pIVar17 = ImGui::GetIO(), fVar31 = (pIVar17->Fonts->Fonts).Data[1]->FontSize,
                     this_01->FontSize <= fVar31 && fVar31 != this_01->FontSize)) {
                    pIVar17 = ImGui::GetIO();
                    lVar22 = 8;
                    goto LAB_0011f118;
                  }
                }
                else {
                  pIVar17 = ImGui::GetIO();
                  lVar22 = 0x10;
LAB_0011f118:
                  font = *(ImFont **)((long)(pIVar17->Fonts->Fonts).Data + lVar22);
                }
                if (this_01->FontSize * 0.75 <= (float)local_3a18._0_4_) {
                  if ((this_01->FontSize * 1.5 < (float)local_3a18._0_4_) &&
                     (pIVar17 = ImGui::GetIO(), fVar31 = (pIVar17->Fonts->Fonts).Data[1]->FontSize,
                     this_01->FontSize <= fVar31 && fVar31 != this_01->FontSize)) {
                    pIVar17 = ImGui::GetIO();
                    lVar22 = 8;
                    goto LAB_0011f190;
                  }
                }
                else {
                  pIVar17 = ImGui::GetIO();
                  lVar22 = 0x10;
LAB_0011f190:
                  this_01 = *(ImFont **)((long)(pIVar17->Fonts->Fonts).Data + lVar22);
                }
                fVar31 = this->m_scale * 0.5;
                fStack_3a04 = IVar21.y;
                local_3970.x = local_39a0.x - fVar31;
                local_3970.y = local_39a0.y;
                local_3978.x = IVar21.x + local_39a0.x + fVar31;
                local_3978.y = fStack_3a04 + local_39a0.y;
                ImDrawList::AddRectFilled
                          (pIVar14,&local_3970,&local_3978,(this->m_colors).pinTextBackgroundColor,
                           fVar31,0);
                ImDrawListSplitter::SetCurrentChannel(local_3980,pIVar14,4);
                ImDrawList::AddText(pIVar14,font,fVar29,local_39d0,local_39ac,
                                    *(char **)(*plVar25 + 0x30),(char *)0x0,0.0,(ImVec4 *)0x0);
                ImDrawList::AddText(pIVar14,this_01,(float)local_3a18._0_4_,&local_39a0,local_39ac,
                                    *(char **)(*(long *)(*plVar25 + 0x60) + 0x10),(char *)0x0,0.0,
                                    (ImVec4 *)0x0);
                ImDrawListSplitter::SetCurrentChannel(local_3980,pIVar14,3);
                if (local_39f0 != (ImVec2)&local_39e0) {
                  operator_delete((void *)local_39f0,local_39e0 + 1);
                }
              }
            }
          }
        }
        plVar25 = plVar25 + 2;
        ptr = pvStack_d80;
      } while (plVar25 != local_3940);
    }
  }
  if (ptr != (void *)0x0) {
    ImGui::MemFree(ptr);
  }
  return;
}

Assistant:

inline void BoardView::DrawPins(ImDrawList *draw) {

	uint32_t cmask  = 0xFFFFFFFF;
	uint32_t omask  = 0x00000000;
	float threshold = 0;
	auto io         = ImGui::GetIO();

	if (!config.showPins) return;

	/*
	 * If we have a pin selected, then it makes it
	 * easier to see where the associated pins are
	 * by masking out (alpha or channel) the other
	 * pins so they're fainter.
	 */
	if (config.pinSelectMasks) {
		if (m_pinSelected || m_pinHighlighted.size()) {
			cmask = m_colors.selectedMaskPins;
			omask = m_colors.orMaskPins;
		}
	}

	if (config.slowCPU) {
		threshold      = 2.0f;
	}
	if (config.pinSizeThresholdLow > threshold) threshold = config.pinSizeThresholdLow;

	draw->ChannelsSetCurrent(kChannelPins);

	if (m_pinSelected) DrawNetWeb(draw);

	for (auto &pin : m_board->Pins()) {
		float psz           = pin->diameter * m_scale;
		uint32_t fill_color = 0xFFFF8888; // fallback fill colour
		uint32_t text_color = m_colors.pinDefaultTextColor;
		uint32_t color      = (m_colors.pinDefaultColor & cmask) | omask;
		bool fill_pin       = false;
		bool show_text      = false;
		bool draw_ring      = true;

		// continue if pin is not visible anyway
		if (!BoardElementIsVisible(pin)) continue;

		ImVec2 pos = CoordToScreen(pin->position.x, pin->position.y);
		{
			if (!IsVisibleScreen(pos.x, pos.y, psz, io)) continue;
		}

		if ((!m_pinSelected) && (psz < threshold)) continue;

		// color & text depending on app state & pin type

		{
			/*
			 * Pins resulting from a net search
			 */
			if (contains(pin, m_pinHighlighted)) {
				if (psz < config.fontSize / 2) psz = config.fontSize / 2;
				text_color = m_colors.pinSelectedTextColor;
				fill_color = m_colors.pinSelectedFillColor;
				color      = m_colors.pinSelectedColor;
				// text_color = color = m_colors.pinSameNetColor;
				fill_pin  = true;
				show_text = true;
				draw_ring = true;
				threshold = 0;
				//				draw->AddCircle(ImVec2(pos.x, pos.y), psz * pinHaloDiameter, ImColor(0xff0000ff), 32);
			}

			/*
			 * If the part is selected, as part of search or otherwise
			 */
			if (PartIsHighlighted(pin->component)) {
				color      = m_colors.pinDefaultColor;
				text_color = m_colors.pinDefaultTextColor;
				fill_pin   = false;
				draw_ring  = true;
				show_text  = true;
				threshold  = 0;
			}

			if (pin->type == Pin::kPinTypeTestPad) {
				color      = (m_colors.pinTestPadColor & cmask) | omask;
				fill_color = (m_colors.pinTestPadFillColor & cmask) | omask;
				show_text  = false;
			}

			// If the part itself is highlighted ( CVMShowPins )
			// if (p_pin->component->visualmode == p_pin->component->CVMSelected) {
			if (pin->component->visualmode == pin->component->CVMSelected) {
				color      = m_colors.pinDefaultColor;
				text_color = m_colors.pinDefaultTextColor;
				fill_pin   = false;
				draw_ring  = true;
				show_text  = true;
				threshold  = 0;
			}

			if (!pin->net || pin->type == Pin::kPinTypeNotConnected) {
				color = (m_colors.pinNotConnectedColor & cmask) | omask;
			} else {
				if (pin->net->is_ground) color = (m_colors.pinGroundColor & cmask) | omask;
			}

			// pin is on the same net as selected pin: highlight > rest
			if (m_pinSelected && pin->net == m_pinSelected->net) {
				if (psz < config.fontSize / 2) psz = config.fontSize / 2;
				color      = m_colors.pinSameNetColor;
				text_color = m_colors.pinSameNetTextColor;
				fill_color = m_colors.pinSameNetFillColor;
				draw_ring  = false;
				fill_pin   = true;
				show_text  = true; // is this something we want? Maybe an optional thing?
				threshold  = 0;
			}

			// pin selected overwrites everything
			// if (p_pin == m_pinSelected) {
			if (pin == m_pinSelected) {
				if (psz < config.fontSize / 2) psz = config.fontSize / 2;
				color      = m_colors.pinSelectedColor;
				text_color = m_colors.pinSelectedTextColor;
				fill_color = m_colors.pinSelectedFillColor;
				draw_ring  = false;
				show_text  = true;
				fill_pin   = true;
				threshold  = 0;
			}

			// Check for BGA pin '1'
			//
			if (pin->name == "A1") {
				color = fill_color = m_colors.pinA1PadColor;
				fill_pin           = m_colors.pinA1PadColor;
				draw_ring          = false;
			}

			if ((pin->number == "1")) {
				if (pin->component->pins.size() >= static_cast<unsigned int>(config.pinA1threshold)) { // config.pinA1threshold is never negative
					color = fill_color = m_colors.pinA1PadColor;
					fill_pin           = m_colors.pinA1PadColor;
					draw_ring          = false;
				}
			}

			// don't show text if it doesn't make sense
			if (pin->component->pins.size() <= 1) show_text = false;
			if (pin->type == Pin::kPinTypeTestPad) show_text = false;
		}

		// Drawing
		{
			int segments;
			//			draw->ChannelsSetCurrent(kChannelImages);

			// for the round pin representations, choose how many circle segments need
			// based on the pin size
			segments = round(psz);
			if (segments > 32) segments = 32;
			if (segments < 8) segments = 8;
			float h = psz / 2 + 0.5f;

			/*
			 * if we're going to be showing the text of a pin, then we really
			 * should make sure that the drawn pin is at least as big as a single
			 * character so it doesn't look messy
			 */
			if ((show_text) && (psz < config.fontSize / 2)) psz = config.fontSize / 2;

			switch (pin->type) {
				case Pin::kPinTypeTestPad:
					if ((psz > 3) && (!config.slowCPU)) {
						draw->AddCircleFilled(ImVec2(pos.x, pos.y), psz, fill_color, segments);
						draw->AddCircle(ImVec2(pos.x, pos.y), psz, color, segments);
					} else if (psz > threshold) {
						draw->AddRectFilled(ImVec2(pos.x - h, pos.y - h), ImVec2(pos.x + h, pos.y + h), fill_color);
					}
					break;
				default:
					if ((psz > 3) && (psz > threshold)) {
						if (config.pinShapeSquare || config.slowCPU) {
							if (fill_pin)
								draw->AddRectFilled(ImVec2(pos.x - h, pos.y - h), ImVec2(pos.x + h, pos.y + h), fill_color);
							if (draw_ring) draw->AddRect(ImVec2(pos.x - h, pos.y - h), ImVec2(pos.x + h, pos.y + h), color);
						} else {
							if (fill_pin) draw->AddCircleFilled(ImVec2(pos.x, pos.y), psz, fill_color, segments);
							if (draw_ring) draw->AddCircle(ImVec2(pos.x, pos.y), psz, color, segments);
						}
					} else if (psz > threshold) {
						if (fill_pin) draw->AddRectFilled(ImVec2(pos.x - h, pos.y - h), ImVec2(pos.x + h, pos.y + h), fill_color);
						if (draw_ring) draw->AddRect(ImVec2(pos.x - h, pos.y - h), ImVec2(pos.x + h, pos.y + h), color);
					}
			}

			// if (p_pin == m_pinSelected) {
			//		if (pin.get() == m_pinSelected) {
			//			draw->AddCircle(ImVec2(pos.x, pos.y), psz + 1.25, m_colors.pinSelectedTextColor, segments);
			//		}

			//		if ((color == m_colors.pinSameNetColor) && (pinHalo == true)) {
			//			draw->AddCircle(ImVec2(pos.x, pos.y), psz * pinHaloDiameter, m_colors.pinHaloColor, segments,
			// config.pinHaloThickness);
			//		}

			// Show all pin names when config.showPinName is enabled and pin diameter is above threshold or show pin name only for selected part
			if ((config.showPinName && psz > 3) || show_text) {
				std::string text = pin->name + "\n" + pin->net->name;
				ImFont *font = ImGui::GetIO().Fonts->Fonts[0]; // Default font
				ImVec2 text_size_normalized = font->CalcTextSizeA(1.0f, FLT_MAX, 0.0f, text.c_str());

				float maxfontwidth = psz * 2.125/ text_size_normalized.x; // Fit horizontally with 6.75% overflow (should still avoid colliding with neighbours)
				float maxfontheight = psz * 1.5/ text_size_normalized.y; // Fit vertically with 25% top/bottom padding
				float maxfontsize = std::min(maxfontwidth, maxfontheight);

				// Font size for pin name only depends on height of text (rather than width of full text incl. net name) to scale to pin bounding box
				ImVec2 size_pin_name = font->CalcTextSizeA(maxfontheight, FLT_MAX, 0.0f, pin->name.c_str());
				// Font size for net name also depends on width of full text to avoid overflowing too much and colliding with text from other pin
				ImVec2 size_net_name = font->CalcTextSizeA(maxfontsize, FLT_MAX, 0.0f, pin->net->name.c_str());

				// Show pin name above net name, full text is centered vertically
				ImVec2 pos_pin_name   = ImVec2(pos.x - size_pin_name.x * 0.5f, pos.y - size_pin_name.y);
				ImVec2 pos_net_name   = ImVec2(pos.x - size_net_name.x * 0.5f, pos.y);

				ImFont *font_pin_name = font;
				if (maxfontheight < font->FontSize * 0.75) {
					font_pin_name = ImGui::GetIO().Fonts->Fonts[2]; // Use smaller font for pin name
				} else if (maxfontheight > font->FontSize * 1.5 && ImGui::GetIO().Fonts->Fonts[1]->FontSize > font->FontSize) {
					font_pin_name = ImGui::GetIO().Fonts->Fonts[1]; // Use larger font for pin name
				}

				ImFont *font_net_name = font;
				if (maxfontsize < font->FontSize * 0.75) {
					font_net_name = ImGui::GetIO().Fonts->Fonts[2]; // Use smaller font for net name
				} else if (maxfontsize > font->FontSize * 1.5 && ImGui::GetIO().Fonts->Fonts[1]->FontSize > font->FontSize) {
					font_net_name = ImGui::GetIO().Fonts->Fonts[1]; // Use larger font for net name
				}

				// Background rectangle
				draw->AddRectFilled(ImVec2(pos_net_name.x - m_scale * 0.5f, pos_net_name.y), // Begining of text with slight padding
										ImVec2(pos_net_name.x + size_net_name.x + m_scale * 0.5f, pos_net_name.y + size_net_name.y), // End of text with slight padding
										m_colors.pinTextBackgroundColor,
										m_scale * 0.5f/*rounding*/);

				draw->ChannelsSetCurrent(kChannelText);
				draw->AddText(font_pin_name, maxfontheight, pos_pin_name, text_color, pin->name.c_str());
				draw->AddText(font_net_name, maxfontsize, pos_net_name, text_color, pin->net->name.c_str());
				draw->ChannelsSetCurrent(kChannelPins);
			}
		}
	}
}